

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

int __thiscall
testing::internal::ParameterizedTestSuiteInfo<test_libaom::AV1CornerMatch::AV1CornerMatchTest>::
AddTestSuiteInstantiation
          (ParameterizedTestSuiteInfo<test_libaom::AV1CornerMatch::AV1CornerMatchTest> *this,
          string *instantiation_name,GeneratorCreationFunc *func,ParamNameGeneratorFunc *name_func,
          char *file,int line)

{
  pointer pcVar1;
  InstantiationInfo local_70;
  
  local_70.name._M_dataplus._M_p = (pointer)&local_70.name.field_2;
  pcVar1 = (instantiation_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + instantiation_name->_M_string_length);
  local_70.generator = func;
  local_70.name_func = name_func;
  local_70.file = file;
  local_70.line = line;
  std::
  vector<testing::internal::ParameterizedTestSuiteInfo<test_libaom::AV1CornerMatch::AV1CornerMatchTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<test_libaom::AV1CornerMatch::AV1CornerMatchTest>::InstantiationInfo>_>
  ::
  emplace_back<testing::internal::ParameterizedTestSuiteInfo<test_libaom::AV1CornerMatch::AV1CornerMatchTest>::InstantiationInfo>
            (&this->instantiations_,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.name._M_dataplus._M_p != &local_70.name.field_2) {
    operator_delete(local_70.name._M_dataplus._M_p);
  }
  return 0;
}

Assistant:

int AddTestSuiteInstantiation(const std::string& instantiation_name,
                                GeneratorCreationFunc* func,
                                ParamNameGeneratorFunc* name_func,
                                const char* file, int line) {
    instantiations_.push_back(
        InstantiationInfo(instantiation_name, func, name_func, file, line));
    return 0;  // Return value used only to run this method in namespace scope.
  }